

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_combo_begin_symbol(nk_context *ctx,nk_symbol_type symbol,nk_vec2 size)

{
  nk_key nVar1;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect header_00;
  nk_vec2 size_00;
  nk_widget_layout_states nVar2;
  nk_key *pnVar3;
  nk_input *in_RDI;
  float fVar4;
  float type;
  float fVar5;
  float state;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float is_clicked_00;
  undefined8 in_XMM0_Qa;
  nk_color unaff_retaddr;
  nk_color unaff_retaddr_00;
  nk_symbol_type sym;
  nk_rect in_stack_00000008;
  nk_rect button;
  nk_rect content;
  nk_rect bounds;
  nk_color symbol_color;
  nk_color sym_background;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  undefined8 in_stack_ffffffffffffff58;
  nk_button_behavior behavior;
  nk_input *i;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  nk_color in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  nk_color in_stack_ffffffffffffff9c;
  uint uVar12;
  nk_color nVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float fStack_3c;
  nk_input *font;
  float in_stack_fffffffffffffff0;
  nk_symbol_type type_00;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffffc;
  nk_bool nVar17;
  
  behavior = (nk_button_behavior)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  type_00 = (nk_symbol_type)in_XMM0_Qa;
  uVar16 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  uVar15 = 0;
  if (((in_RDI == (nk_input *)0x0) || (in_RDI[0x2e].keyboard.keys[5] == (nk_key)0x0)) ||
     (*(long *)((long)in_RDI[0x2e].keyboard.keys[5] + 0xa8) == 0)) {
    nVar17 = 0;
  }
  else {
    nVar1 = in_RDI[0x2e].keyboard.keys[5];
    font = in_RDI;
    nVar2 = nk_widget((nk_rect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (nk_context *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (nVar2 == NK_WIDGET_INVALID) {
      nVar17 = 0;
    }
    else {
      if (((*(uint *)(*(long *)((long)nVar1 + 0xa8) + 4) & 0x1000) != 0) ||
         (i = font, nVar2 == NK_WIDGET_ROM)) {
        i = (nk_input *)0x0;
      }
      r.y = (float)in_stack_ffffffffffffff78;
      r.x = in_stack_ffffffffffffff74;
      r.w = (float)in_stack_ffffffffffffff7c;
      r.h = in_stack_ffffffffffffff80;
      nVar17 = nk_button_behavior((nk_flags *)
                                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),r,i,
                                  behavior);
      if (nVar17 != 0) {
        uVar15 = 1;
      }
      if ((font[0x16].keyboard.keys[0x10].down & 0x20U) == 0) {
        if ((font[0x16].keyboard.keys[0x10].down & 0x10U) == 0) {
          pnVar3 = (nk_key *)&in_RDI[0x12].mouse.scroll_delta.y;
          uVar12 = in_RDI[0x13].keyboard.keys[0xd].clicked;
        }
        else {
          pnVar3 = in_RDI[0x13].keyboard.keys + 3;
          uVar12 = in_RDI[0x13].keyboard.keys[0xd].clicked;
        }
      }
      else {
        pnVar3 = in_RDI[0x13].keyboard.keys + 7;
        uVar12 = in_RDI[0x13].keyboard.keys[0xe].down;
      }
      uVar14 = (undefined4)((ulong)pnVar3 >> 0x20);
      if (pnVar3->down == 1) {
        in_stack_ffffffffffffff9c = nk_rgba(0,0,0,0);
        r_00.y = (float)in_stack_ffffffffffffff8c;
        r_00.x = (float)in_stack_ffffffffffffff88;
        r_00.w = (float)in_stack_ffffffffffffff90;
        r_00.h = in_stack_ffffffffffffff94;
        nVar13 = in_stack_ffffffffffffff9c;
        nk_draw_image((nk_command_buffer *)
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),r_00,
                      (nk_image *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff84);
      }
      else {
        nVar13 = *(nk_color *)(pnVar3 + 1);
        rect.y = (float)in_stack_ffffffffffffff8c;
        rect.x = (float)in_stack_ffffffffffffff88;
        rect.w = (float)in_stack_ffffffffffffff90;
        rect.h = in_stack_ffffffffffffff94;
        nk_fill_rect((nk_command_buffer *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),rect,
                     in_stack_ffffffffffffff74,in_stack_ffffffffffffff84);
        rect_00.y = (float)in_stack_ffffffffffffff8c;
        rect_00.x = (float)in_stack_ffffffffffffff88;
        rect_00.w = (float)in_stack_ffffffffffffff90;
        rect_00.h = in_stack_ffffffffffffff94;
        nk_stroke_rect((nk_command_buffer *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),rect_00,
                       in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff84
                      );
      }
      memset(&stack0xffffffffffffff8c,0,0x10);
      fVar9 = in_RDI[0x13].mouse.pos.y;
      fVar4 = fStack_3c - (fVar9 + fVar9);
      type = ((in_stack_ffffffffffffffb8 + in_stack_ffffffffffffffc0) - fStack_3c) -
             in_RDI[0x13].mouse.pos.y;
      fVar5 = in_stack_ffffffffffffffbc + in_RDI[0x13].mouse.pos.y;
      state = type + *(float *)(in_RDI[0x13].keyboard.text + 8);
      fVar6 = fVar5 + *(float *)(in_RDI[0x13].keyboard.text + 0xc);
      fVar9 = *(float *)(in_RDI[0x13].keyboard.text + 8);
      fVar7 = fVar4 - (fVar9 + fVar9);
      fVar9 = *(float *)(in_RDI[0x13].keyboard.text + 0xc);
      fVar8 = fVar4 - (fVar9 + fVar9);
      fVar9 = in_RDI[0x13].mouse.buttons[3].clicked_pos.y;
      fVar9 = fStack_3c - (fVar9 + fVar9);
      fVar10 = in_stack_ffffffffffffffbc + in_RDI[0x13].mouse.buttons[3].clicked_pos.y;
      fVar11 = in_stack_ffffffffffffffb8 + in_RDI[0x13].mouse.buttons[3].clicked_pos.x;
      is_clicked_00 = (type - in_RDI[0x13].mouse.buttons[3].clicked_pos.y) - fVar11;
      nk_draw_symbol((nk_command_buffer *)CONCAT44(in_stack_fffffffffffffffc,uVar16),type_00,
                     in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffff0,
                     (nk_user_font *)font);
      nk_draw_button_symbol
                ((nk_command_buffer *)CONCAT44(is_clicked_00,fVar10),
                 (nk_rect *)CONCAT44(fVar11,fVar8),(nk_rect *)CONCAT44(fVar7,fVar6),(nk_flags)state,
                 (nk_style_button *)CONCAT44(fVar4,fVar5),(nk_symbol_type)type,
                 (nk_user_font *)CONCAT44(nVar13,uVar12));
      size_00.y = in_stack_ffffffffffffffc0;
      size_00.x = in_stack_ffffffffffffffbc;
      header_00.y = (float)nVar2;
      header_00.x = (float)uVar14;
      header_00.w = (float)uVar15;
      header_00.h = in_stack_ffffffffffffffb8;
      nVar17 = nk_combo_begin((nk_context *)CONCAT44(nVar13,uVar12),
                              (nk_window *)CONCAT44(in_stack_ffffffffffffff9c,fVar9),size_00,
                              (nk_bool)is_clicked_00,header_00);
    }
  }
  return nVar17;
}

Assistant:

NK_API nk_bool
nk_combo_begin_symbol(struct nk_context *ctx, enum nk_symbol_type symbol, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_style *style;
const struct nk_input *in;

struct nk_rect header;
int is_clicked = nk_false;
enum nk_widget_layout_states s;
const struct nk_style_item *background;
struct nk_color sym_background;
struct nk_color symbol_color;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
s = nk_widget(&header, ctx);
if (s == NK_WIDGET_INVALID)
return 0;

in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
is_clicked = nk_true;

/* draw combo box header background and border */
if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
background = &style->combo.active;
symbol_color = style->combo.symbol_active;
} else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
background = &style->combo.hover;
symbol_color = style->combo.symbol_hover;
} else {
background = &style->combo.normal;
symbol_color = style->combo.symbol_hover;
}

if (background->type == NK_STYLE_ITEM_IMAGE) {
sym_background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
sym_background = background->data.color;
nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
}
{
struct nk_rect bounds = {0,0,0,0};
struct nk_rect content;
struct nk_rect button;

enum nk_symbol_type sym;
if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
sym = style->combo.sym_hover;
else if (is_clicked)
sym = style->combo.sym_active;
else sym = style->combo.sym_normal;

/* calculate button */
button.w = header.h - 2 * style->combo.button_padding.y;
button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
button.y = header.y + style->combo.button_padding.y;
button.h = button.w;

content.x = button.x + style->combo.button.padding.x;
content.y = button.y + style->combo.button.padding.y;
content.w = button.w - 2 * style->combo.button.padding.x;
content.h = button.h - 2 * style->combo.button.padding.y;

/* draw symbol */
bounds.h = header.h - 2 * style->combo.content_padding.y;
bounds.y = header.y + style->combo.content_padding.y;
bounds.x = header.x + style->combo.content_padding.x;
bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
nk_draw_symbol(&win->buffer, symbol, bounds, sym_background, symbol_color,
1.0f, style->font);

/* draw open/close button */
nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
&ctx->style.combo.button, sym, style->font);
}
return nk_combo_begin(ctx, win, size, is_clicked, header);
}